

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Alias::compile
          (Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Alias *this)

{
  Node *resolver;
  Reader expression;
  Builder brandBuilder;
  uint scopeParameterCount;
  Impl *this_00;
  uint64_t scopeId;
  ErrorReporter *errorReporter;
  Arena *this_01;
  BuilderFor<capnp::schema::Brand> local_130;
  SegmentReader *local_108;
  CapTableReader *pCStack_100;
  void *local_f8;
  WirePointer *pWStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  local_d8;
  Type local_68;
  undefined1 local_60 [64];
  Workspace *local_20;
  Workspace *workspace;
  Alias *this_local;
  
  workspace = (Workspace *)this;
  this_local = (Alias *)__return_storage_ptr__;
  if ((this->initialized & 1U) == 0) {
    this->initialized = true;
    this_00 = CompiledModule::getCompiler(this->module);
    local_20 = Compiler::Impl::getWorkspace(this_00);
    Orphanage::newOrphan<capnp::schema::Brand>
              ((Orphan<capnp::schema::Brand> *)(local_60 + 0x20),&local_20->orphanage);
    Orphan<capnp::schema::Brand>::operator=
              (&this->brandOrphan,(Orphan<capnp::schema::Brand> *)(local_60 + 0x20));
    Orphan<capnp::schema::Brand>::~Orphan((Orphan<capnp::schema::Brand> *)(local_60 + 0x20));
    this_01 = &local_20->arena;
    local_68.this = this;
    kj::defer<capnp::compiler::Compiler::Alias::compile()::__0>((kj *)local_60,&local_68);
    kj::Arena::copy<kj::_::Deferred<capnp::compiler::Compiler::Alias::compile()::__0>>
              (this_01,(Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:368:36)>
                        *)local_60);
    kj::_::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/compiler.c++:368:36)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_compiler_c__:368:36)>
                 *)local_60);
    scopeId = Node::getId(this->parent);
    scopeParameterCount = Node::getParameterCount(this->parent);
    resolver = this->parent;
    errorReporter = CompiledModule::getErrorReporter(this->module);
    local_108 = (this->targetName)._reader.segment;
    pCStack_100 = (this->targetName)._reader.capTable;
    local_f8 = (this->targetName)._reader.data;
    pWStack_f0 = (this->targetName)._reader.pointers;
    local_e8._0_4_ = (this->targetName)._reader.dataSize;
    local_e8._4_2_ = (this->targetName)._reader.pointerCount;
    local_e8._6_2_ = *(undefined2 *)&(this->targetName)._reader.field_0x26;
    uStack_e0 = *(undefined8 *)&(this->targetName)._reader.nestingLimit;
    Orphan<capnp::schema::Brand>::get(&local_130,&this->brandOrphan);
    expression._reader.capTable = pCStack_100;
    expression._reader.segment = local_108;
    expression._reader.data = local_f8;
    expression._reader.pointers = pWStack_f0;
    expression._reader.dataSize = (undefined4)local_e8;
    expression._reader.pointerCount = local_e8._4_2_;
    expression._reader._38_2_ = local_e8._6_2_;
    expression._reader._40_8_ = uStack_e0;
    brandBuilder._builder.capTable = local_130._builder.capTable;
    brandBuilder._builder.segment = local_130._builder.segment;
    brandBuilder._builder.data = local_130._builder.data;
    brandBuilder._builder.pointers = local_130._builder.pointers;
    brandBuilder._builder.dataSize = local_130._builder.dataSize;
    brandBuilder._builder.pointerCount = local_130._builder.pointerCount;
    brandBuilder._builder._38_2_ = local_130._builder._38_2_;
    NodeTranslator::compileDecl
              (&local_d8,scopeId,scopeParameterCount,&resolver->super_Resolver,errorReporter,
               expression,brandBuilder);
    kj::
    Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::operator=(&this->target,&local_d8);
    kj::
    Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
    ::~Maybe(&local_d8);
  }
  kj::
  Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
  ::Maybe(__return_storage_ptr__,&this->target);
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Resolver::ResolveResult> Compiler::Alias::compile() {
  if (!initialized) {
    initialized = true;

    auto& workspace = module.getCompiler().getWorkspace();
    brandOrphan = workspace.orphanage.newOrphan<schema::Brand>();

    // If the Workspace is destroyed, revert the alias to the uninitialized state, because the
    // orphan we created is no longer valid in this case.
    workspace.arena.copy(kj::defer([this]() {
      initialized = false;
      brandOrphan = Orphan<schema::Brand>();
    }));

    target = NodeTranslator::compileDecl(
        parent.getId(), parent.getParameterCount(), parent,
        module.getErrorReporter(), targetName, brandOrphan.get());
  }

  return target;
}